

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O2

void __thiscall Configurator::~Configurator(Configurator *this)

{
  std::ios_base::~ios_base((ios_base *)&this->field_0x28);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Configurator() {}